

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio_lib.c
# Opt level: O0

int BIO_free(BIO *a)

{
  long lVar1;
  size_t unaff_retaddr;
  char *in_stack_00000008;
  int ret;
  BIO *in_stack_00000018;
  long in_stack_00000030;
  size_t *in_stack_00000038;
  int local_14;
  int in_stack_fffffffffffffffc;
  int iVar2;
  
  if (a == (BIO *)0x0) {
    iVar2 = 0;
  }
  else {
    iVar2 = CRYPTO_DOWN_REF((int *)&a->num_write,&local_14,a[1].cb_arg);
    if (iVar2 < 1) {
      iVar2 = 0;
    }
    else if (local_14 < 1) {
      if ((a->cb_arg != (char *)0x0) ||
         (lVar1._0_4_ = a->init, lVar1._4_4_ = a->shutdown, lVar1 != 0)) {
        lVar1 = bio_call_callback(in_stack_00000018,ret,in_stack_00000008,unaff_retaddr,
                                  in_stack_fffffffffffffffc,(long)a,in_stack_00000030,
                                  in_stack_00000038);
        local_14 = (int)lVar1;
        if (local_14 < 1) {
          return 0;
        }
      }
      if ((a->callback != (_func_603 *)0x0) && (*(long *)(a->callback + 0x50) != 0)) {
        (**(code **)(a->callback + 0x50))(a);
      }
      CRYPTO_free_ex_data(0xc,a,(CRYPTO_EX_DATA *)(a + 1));
      CRYPTO_THREAD_lock_free((CRYPTO_RWLOCK *)0x21a759);
      CRYPTO_free(a);
      iVar2 = 1;
    }
    else {
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

int BIO_free(BIO *a)
{
    int ret;

    if (a == NULL)
        return 0;

    if (CRYPTO_DOWN_REF(&a->references, &ret, a->lock) <= 0)
        return 0;

    REF_PRINT_COUNT("BIO", a);
    if (ret > 0)
        return 1;
    REF_ASSERT_ISNT(ret < 0);

    if (HAS_CALLBACK(a)) {
        ret = (int)bio_call_callback(a, BIO_CB_FREE, NULL, 0, 0, 0L, 1L, NULL);
        if (ret <= 0)
            return 0;
    }

    if ((a->method != NULL) && (a->method->destroy != NULL))
        a->method->destroy(a);

    CRYPTO_free_ex_data(CRYPTO_EX_INDEX_BIO, a, &a->ex_data);

    CRYPTO_THREAD_lock_free(a->lock);

    OPENSSL_free(a);

    return 1;
}